

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O3

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::SegmentO2::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,SegmentO2 *this,RefinementPattern *ref_pat,dim_t codim)

{
  undefined8 *puVar1;
  double *pdVar2;
  uint uVar3;
  Scalar SVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  __uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
  _Var8;
  runtime_error *prVar9;
  ostream *poVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  childPolygons;
  MatrixXd locCoords;
  stringstream ss;
  undefined1 local_2f0 [32];
  string local_2d0;
  scalar_product_op<double,_double> local_2a9;
  undefined1 local_2a8 [32];
  XprTypeNested local_288;
  ulong local_270;
  pointer local_268;
  long local_260;
  long local_258;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_248;
  undefined **local_228;
  long local_220;
  ulong local_218;
  ulong local_210;
  double local_208;
  scalar_constant_op<double> local_200;
  Rhs local_1f8;
  Rhs local_1e8;
  undefined1 local_1d8 [392];
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_50;
  
  if (ref_pat[8] != (RefinementPattern)0x2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1d8 + 0x10),"Refinement pattern for ",0x17);
    local_2f0[0] = ref_pat[8];
    base::RefEl::ToString_abi_cxx11_((string *)local_2a8,(RefEl *)local_2f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1d8 + 0x10),(char *)local_2a8._0_8_,local_2a8._8_8_);
    pdVar2 = (double *)(local_2a8 + 0x10);
    if ((double *)local_2a8._0_8_ != pdVar2) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    local_2a8._0_8_ = pdVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,"ref_pat.RefEl() == lf::base::RefEl::kSegment()","");
    local_2f0._0_8_ = (long)local_2f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2a8,(string *)local_2f0,0x5d,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
    }
    if ((double *)local_2a8._0_8_ != pdVar2) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar12 = (ulong)codim;
  if (1 < codim) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1d8 + 0x10),"Illegal codim = ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1d8 + 0x10));
    local_2a8._0_8_ = local_2a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"codim < 2","");
    local_2f0._0_8_ = (long)local_2f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2a8,(string *)local_2f0,0x5e,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
    }
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = *(uint *)(ref_pat + 0xc);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)ref_pat + 8))(&local_260,ref_pat,uVar12);
  lVar13 = local_260;
  uVar7 = (*(code *)**(undefined8 **)ref_pat)(ref_pat,codim);
  lVar11 = (local_258 - lVar13 >> 3) * -0x5555555555555555;
  local_270 = uVar12;
  if (lVar11 - (ulong)uVar7 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1d8 + 0x10),"NumChildren ",0xc);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1d8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
    (*(code *)**(undefined8 **)ref_pat)(ref_pat,local_270);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    local_2a8._0_8_ = local_2a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,"noChildren == ref_pat.NumChildren(codim)","");
    local_2f0._0_8_ = (long)local_2f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_2a8,(string *)local_2f0,0x6a,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
    }
    if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_258 != lVar13) {
    local_268 = (pointer)(1.0 / (double)uVar3);
    local_210 = (ulong)(2 - codim);
    local_218 = (ulong)(codim * -2 + 3);
    local_220 = lVar11 + (ulong)(lVar11 == 0);
    lVar13 = 0;
    local_228 = &PTR_DimLocal_004a65f8;
    do {
      if (*(long *)(local_260 + 8 + lVar13 * 0x18) != 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1d8 + 0x10),"childPolygons[child].rows() = ",0x1e);
        std::ostream::_M_insert<long>((long)(local_1d8 + 0x10));
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"childPolygons[child].rows() == 1","");
        local_2f0._0_8_ = (long)local_2f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_2a8,(string *)local_2f0,0x72,&local_2d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"this code should not be reached");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*(ulong *)(local_260 + lVar13 * 0x18 + 0x10) != local_210) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1d8 + 0x10),"childPolygons[child].cols() = ",0x1e);
        std::ostream::_M_insert<long>((long)(local_1d8 + 0x10));
        local_2a8._0_8_ = local_2a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,"childPolygons[child].cols() == (2 - codim)","");
        local_2f0._0_8_ = (long)local_2f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_2a8,(string *)local_2f0,0x75,&local_2d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
        if ((undefined1 *)local_2a8._0_8_ != local_2a8 + 0x10) {
          operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"this code should not be reached");
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_248.m_storage.m_data = (double *)0x0;
      local_248.m_storage.m_rows = 0;
      local_248.m_storage.m_cols = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                (&local_248,1,local_218);
      if ((local_270 & 1) == 0) {
        local_1e8.m_xpr = (XprTypeNested)(local_260 + lVar13 * 0x18);
        local_2d0._M_dataplus._M_p = local_268;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)local_2a8,*(Index *)(local_1e8.m_xpr + 8),
                         *(Index *)(local_1e8.m_xpr + 0x10),(scalar_constant_op<double> *)&local_2d0
                        );
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                         *)local_1d8,(Lhs *)local_2a8,&local_1e8,
                        (scalar_product_op<double,_double> *)&local_1f8);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_2f0,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_248,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                    *)local_1d8);
        local_1f8.m_xpr = (XprTypeNested)(local_260 + lVar13 * 0x18);
        local_200.m_other = (double)local_268;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)&local_2d0,*(Index *)(local_1f8.m_xpr + 8),
                         *(Index *)(local_1f8.m_xpr + 0x10),&local_200);
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                         *)local_2a8,(Lhs *)&local_2d0,&local_1f8,&local_2a9);
        if (*(long *)(local_288 + 0x10) == 0 || *(long *)(local_288 + 8) == 0) {
          local_208 = 0.0;
        }
        else {
          SVar4 = Eigen::
                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,-1,-1,0,-1,-1>const>const>>
                  ::redux<Eigen::internal::scalar_sum_op<double,double>>
                            ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                              *)local_2a8,(scalar_sum_op<double,_double> *)&local_2d0);
          local_208 = SVar4 * 0.5;
        }
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2f0,
                   &local_208);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
                  ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2f0);
        (*(this->super_Geometry)._vptr_Geometry[3])
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                    *)local_1d8,this,&local_248);
        _Var8.
        super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>.
        _M_t.
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
        .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
             (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
             operator_new(0x60);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
        PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_2a8,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1d8);
        SegmentO2((SegmentO2 *)
                  _Var8.
                  super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                  .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl,
                  (Matrix<double,__1,_3,_0,__1,_3> *)local_2a8);
        free((void *)local_2a8._0_8_);
        local_2f0._0_8_ =
             _Var8.
             super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
             ._M_t.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_2f0);
      }
      else {
        local_2f0._0_8_ = local_260 + lVar13 * 0x18;
        local_2d0._M_dataplus._M_p = local_268;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)local_2a8,*(Index *)(local_2f0._0_8_ + 8),
                         *(Index *)(local_2f0._0_8_ + 0x10),(scalar_constant_op<double> *)&local_2d0
                        );
        Eigen::
        CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
        ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                         *)local_1d8,(Lhs *)local_2a8,(Rhs *)local_2f0,
                        (scalar_product_op<double,_double> *)&local_1e8);
        Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
                  ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_50,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_248,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                    *)local_1d8);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(&local_50);
        (*(this->super_Geometry)._vptr_Geometry[3])
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                    *)local_1d8,this,&local_248);
        _Var8.
        super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>.
        _M_t.
        super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
        .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
             (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
             operator_new(0x18);
        local_2a8._0_8_ = (double *)0x0;
        local_2a8._8_8_ = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        resizeLike<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_2a8,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1d8);
        uVar6 = local_1d8._0_8_;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_2a8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)local_1d8,
                   (assign_op<double,_double> *)&local_2d0);
        uVar12 = local_2a8._8_8_ - ((long)local_2a8._8_8_ >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)local_2a8._8_8_) {
          lVar11 = 0;
          do {
            puVar1 = (undefined8 *)(uVar6 + lVar11 * 8);
            uVar5 = puVar1[1];
            *(undefined8 *)(local_2a8._0_8_ + lVar11 * 8) = *puVar1;
            *(undefined8 *)((pointer)(local_2a8._0_8_ + lVar11 * 8) + 8) = uVar5;
            lVar11 = lVar11 + 2;
          } while (lVar11 < (long)uVar12);
        }
        if ((long)uVar12 < (long)local_2a8._8_8_) {
          do {
            *(undefined8 *)(local_2a8._0_8_ + uVar12 * 8) = *(undefined8 *)(uVar6 + uVar12 * 8);
            uVar12 = uVar12 + 1;
          } while (local_2a8._8_8_ != uVar12);
        }
        *(undefined ***)
         _Var8.
         super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
         ._M_t.
         super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
         .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl = local_228;
        (((Matrix<double,__1,_3,_0,__1,_3> *)
         ((long)_Var8.
                super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                ._M_t.
                super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 8))->
        super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data =
             (double *)local_2a8._0_8_;
        *(undefined8 *)
         ((long)_Var8.
                super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                ._M_t.
                super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl + 0x10) =
             local_2a8._8_8_;
        local_2f0._0_8_ =
             _Var8.
             super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
             ._M_t.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
        ::
        emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
                  ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                    *)__return_storage_ptr__,
                   (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                    *)local_2f0);
      }
      if ((_Head_base<0UL,_lf::geometry::Geometry_*,_false>)local_2f0._0_8_ !=
          (_Head_base<0UL,_lf::geometry::Geometry_*,_false>)0x0) {
        (*((Geometry *)local_2f0._0_8_)->_vptr_Geometry[0xb])();
      }
      local_2f0._0_8_ =
           (__uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>)
           0x0;
      free((void *)local_1d8._0_8_);
      free(local_248.m_storage.m_data);
      lVar13 = lVar13 + 1;
    } while (lVar13 != local_220);
  }
  std::
  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
             *)&local_260);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Geometry>> SegmentO2::ChildGeometry(
    const RefinementPattern& ref_pat, base::dim_t codim) const {
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kSegment(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG(codim < 2, "Illegal codim = " << codim);

  const double hLattice = 1. / static_cast<double>(ref_pat.LatticeConst());
  std::vector<std::unique_ptr<Geometry>> childGeoPtrs = {};

  // get coordinates of childGeometries
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>> childPolygons(
      ref_pat.ChildPolygons(codim));

  const size_t noChildren = childPolygons.size();
  LF_VERIFY_MSG(
      noChildren == ref_pat.NumChildren(codim),
      "NumChildren " << noChildren << " <-> " << ref_pat.NumChildren(codim));

  // create a geometry object for each child
  for (size_t child = 0; child < noChildren; ++child) {
    // codim == 0: a child segment is described by a polygon with three vertices
    // codim == 1: a child point by a single point ("polygon with one corner")
    LF_VERIFY_MSG(
        childPolygons[child].rows() == 1,
        "childPolygons[child].rows() = " << childPolygons[child].rows());
    LF_VERIFY_MSG(
        childPolygons[child].cols() == (2 - codim),
        "childPolygons[child].cols() = " << childPolygons[child].cols());

    Eigen::MatrixXd locCoords(1, 3 - 2 * codim);

    switch (codim) {
      case 0: {
        // SegmentO2 requires the coordinate of the midpoint
        locCoords << hLattice * childPolygons[child].cast<double>(),
            (hLattice * childPolygons[child].cast<double>()).sum() / 2;
        childGeoPtrs.push_back(std::make_unique<SegmentO2>(Global(locCoords)));

        break;
      }
      case 1: {
        locCoords << hLattice * childPolygons[child].cast<double>();
        childGeoPtrs.push_back(std::make_unique<Point>(Global(locCoords)));

        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
      }
    }
  }

  return childGeoPtrs;
}